

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O2

ostream * Catch::clara::TextFlow::operator<<(ostream *os,Column *col)

{
  bool bVar1;
  bool bVar2;
  string line;
  iterator __end3;
  iterator __begin3;
  string local_b0;
  iterator local_90;
  iterator local_60;
  
  Column::iterator::iterator(&local_60,col);
  local_90.m_stringIndex =
       (long)(col->m_strings).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(col->m_strings).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5;
  local_90.m_pos = 0;
  local_90.m_len._0_1_ = 0;
  local_90.m_len._1_7_ = 0;
  local_90.m_end._0_1_ = 0;
  local_90._33_8_ = 0;
  bVar2 = true;
  local_90.m_column = col;
  while( true ) {
    bVar1 = Column::iterator::operator!=(&local_60,&local_90);
    if (!bVar1) break;
    Column::iterator::operator*[abi_cxx11_(&local_b0,&local_60);
    if (!bVar2) {
      ::std::operator<<((ostream *)os,"\n");
    }
    ::std::operator<<((ostream *)os,(string *)&local_b0);
    ::std::__cxx11::string::~string((string *)&local_b0);
    Column::iterator::operator++(&local_60);
    bVar2 = false;
  }
  return os;
}

Assistant:

inline friend std::ostream& operator << (std::ostream& os, Column const& col) {
		bool first = true;
		for (auto line : col) {
			if (first)
				first = false;
			else
				os << "\n";
			os << line;
		}
		return os;
	}